

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O3

bool __thiscall
draco::GeometryAttribute::ConvertTypedValue<float,long>
          (GeometryAttribute *this,AttributeValueIndex att_id,uint8_t out_num_components,
          long *out_value)

{
  bool bVar1;
  float fVar2;
  pointer puVar3;
  pointer puVar4;
  undefined8 uVar5;
  byte bVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  
  uVar7 = *(uint *)&this->num_components_;
  bVar6 = out_num_components;
  if ((byte)uVar7 < out_num_components) {
    bVar6 = (byte)uVar7;
  }
  if (bVar6 != 0) {
    puVar3 = (this->buffer_->data_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = this->byte_offset_ + (ulong)att_id.value_ * this->byte_stride_;
    puVar4 = (this->buffer_->data_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar1 = this->normalized_;
    lVar8 = 0;
    uVar9 = 0;
    do {
      if (puVar4 <= puVar3 + lVar8 + uVar5) {
        return false;
      }
      fVar2 = *(float *)(puVar3 + uVar9 * 4 + uVar5);
      if (9.223372e+18 <= fVar2) {
        return false;
      }
      if ((bVar1 & 1U) != 0) {
        return false;
      }
      if (fVar2 < -9.223372e+18) {
        return false;
      }
      if (0x7f7fffff < (uint)ABS(fVar2)) {
        return false;
      }
      out_value[uVar9] = (long)fVar2;
      uVar9 = uVar9 + 1;
      uVar7 = *(uint *)&this->num_components_;
      bVar6 = (byte)uVar7;
      if (out_num_components <= (byte)uVar7) {
        bVar6 = out_num_components;
      }
      lVar8 = lVar8 + 4;
    } while (uVar9 < bVar6);
  }
  if ((byte)uVar7 < out_num_components) {
    memset(out_value + (uVar7 & 0xff),0,(ulong)((uint)out_num_components + ~(uVar7 & 0xff)) * 8 + 8)
    ;
  }
  return true;
}

Assistant:

bool ConvertTypedValue(AttributeValueIndex att_id, uint8_t out_num_components,
                         OutT *out_value) const {
    const uint8_t *src_address = GetAddress(att_id);

    // Convert all components available in both the original and output formats.
    for (int i = 0; i < std::min(num_components_, out_num_components); ++i) {
      if (!IsAddressValid(src_address)) {
        return false;
      }
      const T in_value = *reinterpret_cast<const T *>(src_address);
      if (!ConvertComponentValue<T, OutT>(in_value, normalized_,
                                          out_value + i)) {
        return false;
      }
      src_address += sizeof(T);
    }
    // Fill empty data for unused output components if needed.
    for (int i = num_components_; i < out_num_components; ++i) {
      out_value[i] = static_cast<OutT>(0);
    }
    return true;
  }